

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftinit.c
# Opt level: O1

void FT_Set_Default_Properties(FT_Library library)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  byte local_1d8 [8];
  char module_name [129];
  byte local_148 [8];
  char property_name [129];
  byte local_b8 [8];
  char property_value [129];
  
  pbVar2 = (byte *)getenv("FREETYPE_PROPERTIES");
  if (pbVar2 == (byte *)0x0) {
    return;
  }
  do {
    bVar1 = *pbVar2;
    if ((bVar1 != 9) && (bVar1 != 0x20)) {
      if (bVar1 == 0) {
        return;
      }
      uVar5 = 0;
      do {
        bVar1 = pbVar2[uVar5];
        uVar4 = uVar5;
        if ((bVar1 == 0) || (bVar1 == 0x3a)) goto LAB_001f4248;
        local_1d8[uVar5] = bVar1;
        uVar4 = uVar5 + 1;
        uVar5 = uVar4;
      } while (uVar4 != 0x80);
      uVar5 = 0x80;
LAB_001f4248:
      pbVar3 = pbVar2 + uVar4;
      local_1d8[uVar5 & 0xffffffff] = 0;
      if (*pbVar3 != 0x3a) {
        return;
      }
      if (pbVar3 == pbVar2) {
        return;
      }
      uVar5 = 0;
      do {
        bVar1 = pbVar3[uVar5 + 1];
        if ((bVar1 == 0) || (bVar1 == 0x3d)) {
          lVar6 = uVar5 + 1;
          uVar4 = uVar5;
          goto LAB_001f429f;
        }
        local_148[uVar5] = bVar1;
        uVar4 = uVar5 + 1;
        uVar5 = uVar4;
      } while (uVar4 != 0x80);
      uVar5 = 0x80;
      lVar6 = 0x81;
LAB_001f429f:
      pbVar3 = pbVar3 + uVar4 + 1;
      local_148[uVar5 & 0xffffffff] = 0;
      if (*pbVar3 != 0x3d) {
        return;
      }
      if (lVar6 == 1) {
        return;
      }
      uVar5 = 0;
      do {
        bVar1 = pbVar3[uVar5 + 1];
        if (((ulong)bVar1 < 0x21) && ((0x100000201U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          lVar6 = uVar5 + 1;
          uVar4 = uVar5;
          goto LAB_001f42f6;
        }
        local_b8[uVar5] = bVar1;
        uVar4 = uVar5 + 1;
        uVar5 = uVar4;
      } while (uVar4 != 0x80);
      uVar5 = 0x80;
      lVar6 = 0x81;
LAB_001f42f6:
      pbVar2 = pbVar3 + uVar4 + 1;
      local_b8[uVar5 & 0xffffffff] = 0;
      if (0x20 < (ulong)*pbVar2) {
        return;
      }
      if ((0x100000201U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0) {
        return;
      }
      if (lVar6 == 1) {
        return;
      }
      ft_property_string_set
                (library,(FT_String *)local_1d8,(FT_String *)local_148,(FT_String *)local_b8);
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Set_Default_Properties( FT_Library  library )
  {
    const char*  env;
    const char*  p;
    const char*  q;

    char  module_name[MAX_LENGTH + 1];
    char  property_name[MAX_LENGTH + 1];
    char  property_value[MAX_LENGTH + 1];

    int  i;


    env = ft_getenv( "FREETYPE_PROPERTIES" );
    if ( !env )
      return;

    for ( p = env; *p; p++ )
    {
      /* skip leading whitespace and separators */
      if ( *p == ' ' || *p == '\t' )
        continue;

      /* read module name, followed by `:' */
      q = p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == ':' )
          break;
        module_name[i] = *p++;
      }
      module_name[i] = '\0';

      if ( !*p || *p != ':' || p == q )
        break;

      /* read property name, followed by `=' */
      q = ++p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == '=' )
          break;
        property_name[i] = *p++;
      }
      property_name[i] = '\0';

      if ( !*p || *p != '=' || p == q )
        break;

      /* read property value, followed by whitespace (if any) */
      q = ++p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == ' ' || *p == '\t' )
          break;
        property_value[i] = *p++;
      }
      property_value[i] = '\0';

      if ( !( *p == '\0' || *p == ' ' || *p == '\t' ) || p == q )
        break;

      /* we completely ignore errors */
      ft_property_string_set( library,
                              module_name,
                              property_name,
                              property_value );
    }
  }